

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitMemoryInit
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,MemoryInit *curr)

{
  ExternalInterface *pEVar1;
  Name memory;
  undefined1 this_00 [8];
  char *pcVar2;
  DataSegment *pDVar3;
  uint64_t uVar4;
  size_type sVar5;
  Address memorySize;
  Address AVar6;
  ulong uVar7;
  pointer pcVar8;
  Literal local_178;
  undefined1 local_160 [8];
  Literal addr;
  Flow dest;
  Flow offset;
  Flow size;
  undefined1 local_68 [8];
  MemoryInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)&addr.type,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->dest);
  if (dest.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&dest.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->offset);
    if (offset.breakTo.super_IString.str._M_len == 0) {
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)&offset.breakTo.super_IString.str._M_str,
                 &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->size);
      if (size.breakTo.super_IString.str._M_len == 0) {
        pDVar3 = Module::getDataSegment(this->wasm,(Name)(curr->segment).super_IString.str);
        if (((long)((long)dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start -
                   dest.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3
            ) * -0x5555555555555555 + addr.type.id != 1) {
LAB_005f49db:
          __assert_fail("values.size() == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                        ,0x43,"const Literal &wasm::Flow::getSingleValue()");
        }
        uVar4 = Literal::getUnsigned((Literal *)&dest);
        if (dest.breakTo.super_IString.str._M_str +
            ((long)((long)offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start -
                   offset.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >>
            3) * -0x5555555555555555 != &DAT_00000001) goto LAB_005f49db;
        if (offset.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
            super_IString.str._M_str != (char *)0x2) {
LAB_005f49fa:
          __assert_fail("type == Type::i32",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                        ,0x118,"int32_t wasm::Literal::geti32() const");
        }
        if (offset.breakTo.super_IString.str._M_str +
            ((long)((long)size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start -
                   size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3
            ) * -0x5555555555555555 != &DAT_00000001) goto LAB_005f49db;
        size.breakTo.super_IString.str._M_str = (char *)__return_storage_ptr__;
        if (size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
            super_IString.str._M_str != (char *)0x2) goto LAB_005f49fa;
        uVar7 = (ulong)(uint)size.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
        pcVar8 = (char *)(ulong)(uint)offset.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed
                 + uVar7;
        if (pcVar8 != (pointer)0x0) {
          sVar5 = std::
                  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::count(&(this->droppedSegments)._M_h,&curr->segment);
          if (sVar5 != 0) {
            (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                      (this,"out of bounds segment access in memory.init");
          }
        }
        if ((pDVar3->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish +
            -(long)(pDVar3->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start < pcVar8) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds segment access in memory.init");
        }
        getMemoryInstanceInfo
                  ((MemoryInstanceInfo *)local_68,this,(Name)(curr->memory).super_IString.str);
        memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
        memory.super_IString.str._M_len = (size_t)info.instance;
        info.name.super_IString.str._M_str =
             (char *)(ulong)(uint)offset.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
        memorySize = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_68,memory);
        if (memorySize.addr << 0x10 < uVar4 + uVar7) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds memory access in memory.init");
        }
        if (uVar7 != 0) {
          do {
            this_00 = local_68;
            addr.field_0.func.super_IString.str._M_str = (char *)0x3;
            pEVar1 = *(ExternalInterface **)((long)local_68 + 0x288);
            local_160 = (undefined1  [8])uVar4;
            Literal::Literal(&local_178,(Literal *)local_160);
            AVar6 = getFinalAddressWithoutOffset
                              ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,&local_178,1,
                               memorySize);
            pcVar2 = info.name.super_IString.str._M_str;
            (*pEVar1->_vptr_ExternalInterface[0x16])
                      (pEVar1,AVar6.addr,
                       (ulong)(uint)(int)info.name.super_IString.str._M_str
                                         [(long)(pDVar3->data).
                                                super__Vector_base<char,_std::allocator<char>_>.
                                                _M_impl.super__Vector_impl_data._M_start],
                       info.instance,info.name.super_IString.str._M_len);
            Literal::~Literal(&local_178);
            Literal::~Literal((Literal *)local_160);
            uVar4 = uVar4 + 1;
            info.name.super_IString.str._M_str = pcVar2 + 1;
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
        }
        size.breakTo.super_IString.str._M_str[0x30] = '\0';
        size.breakTo.super_IString.str._M_str[0x31] = '\0';
        size.breakTo.super_IString.str._M_str[0x32] = '\0';
        size.breakTo.super_IString.str._M_str[0x33] = '\0';
        size.breakTo.super_IString.str._M_str[0x34] = '\0';
        size.breakTo.super_IString.str._M_str[0x35] = '\0';
        size.breakTo.super_IString.str._M_str[0x36] = '\0';
        size.breakTo.super_IString.str._M_str[0x37] = '\0';
        size.breakTo.super_IString.str._M_str[0x38] = '\0';
        size.breakTo.super_IString.str._M_str[0x39] = '\0';
        size.breakTo.super_IString.str._M_str[0x3a] = '\0';
        size.breakTo.super_IString.str._M_str[0x3b] = '\0';
        size.breakTo.super_IString.str._M_str[0x3c] = '\0';
        size.breakTo.super_IString.str._M_str[0x3d] = '\0';
        size.breakTo.super_IString.str._M_str[0x3e] = '\0';
        size.breakTo.super_IString.str._M_str[0x3f] = '\0';
        size.breakTo.super_IString.str._M_str[0x20] = '\0';
        size.breakTo.super_IString.str._M_str[0x21] = '\0';
        size.breakTo.super_IString.str._M_str[0x22] = '\0';
        size.breakTo.super_IString.str._M_str[0x23] = '\0';
        size.breakTo.super_IString.str._M_str[0x24] = '\0';
        size.breakTo.super_IString.str._M_str[0x25] = '\0';
        size.breakTo.super_IString.str._M_str[0x26] = '\0';
        size.breakTo.super_IString.str._M_str[0x27] = '\0';
        size.breakTo.super_IString.str._M_str[0x28] = '\0';
        size.breakTo.super_IString.str._M_str[0x29] = '\0';
        size.breakTo.super_IString.str._M_str[0x2a] = '\0';
        size.breakTo.super_IString.str._M_str[0x2b] = '\0';
        size.breakTo.super_IString.str._M_str[0x2c] = '\0';
        size.breakTo.super_IString.str._M_str[0x2d] = '\0';
        size.breakTo.super_IString.str._M_str[0x2e] = '\0';
        size.breakTo.super_IString.str._M_str[0x2f] = '\0';
        size.breakTo.super_IString.str._M_str[0x10] = '\0';
        size.breakTo.super_IString.str._M_str[0x11] = '\0';
        size.breakTo.super_IString.str._M_str[0x12] = '\0';
        size.breakTo.super_IString.str._M_str[0x13] = '\0';
        size.breakTo.super_IString.str._M_str[0x14] = '\0';
        size.breakTo.super_IString.str._M_str[0x15] = '\0';
        size.breakTo.super_IString.str._M_str[0x16] = '\0';
        size.breakTo.super_IString.str._M_str[0x17] = '\0';
        size.breakTo.super_IString.str._M_str[0x18] = '\0';
        size.breakTo.super_IString.str._M_str[0x19] = '\0';
        size.breakTo.super_IString.str._M_str[0x1a] = '\0';
        size.breakTo.super_IString.str._M_str[0x1b] = '\0';
        size.breakTo.super_IString.str._M_str[0x1c] = '\0';
        size.breakTo.super_IString.str._M_str[0x1d] = '\0';
        size.breakTo.super_IString.str._M_str[0x1e] = '\0';
        size.breakTo.super_IString.str._M_str[0x1f] = '\0';
        size.breakTo.super_IString.str._M_str[0] = '\0';
        size.breakTo.super_IString.str._M_str[1] = '\0';
        size.breakTo.super_IString.str._M_str[2] = '\0';
        size.breakTo.super_IString.str._M_str[3] = '\0';
        size.breakTo.super_IString.str._M_str[4] = '\0';
        size.breakTo.super_IString.str._M_str[5] = '\0';
        size.breakTo.super_IString.str._M_str[6] = '\0';
        size.breakTo.super_IString.str._M_str[7] = '\0';
        size.breakTo.super_IString.str._M_str[8] = '\0';
        size.breakTo.super_IString.str._M_str[9] = '\0';
        size.breakTo.super_IString.str._M_str[10] = '\0';
        size.breakTo.super_IString.str._M_str[0xb] = '\0';
        size.breakTo.super_IString.str._M_str[0xc] = '\0';
        size.breakTo.super_IString.str._M_str[0xd] = '\0';
        size.breakTo.super_IString.str._M_str[0xe] = '\0';
        size.breakTo.super_IString.str._M_str[0xf] = '\0';
        size.breakTo.super_IString.str._M_str[0x40] = '\0';
        size.breakTo.super_IString.str._M_str[0x41] = '\0';
        size.breakTo.super_IString.str._M_str[0x42] = '\0';
        size.breakTo.super_IString.str._M_str[0x43] = '\0';
        size.breakTo.super_IString.str._M_str[0x44] = '\0';
        size.breakTo.super_IString.str._M_str[0x45] = '\0';
        size.breakTo.super_IString.str._M_str[0x46] = '\0';
        size.breakTo.super_IString.str._M_str[0x47] = '\0';
        __return_storage_ptr__ = (Flow *)size.breakTo.super_IString.str._M_str;
      }
      else {
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
             (size_t)offset.breakTo.super_IString.str._M_str;
        Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                         fixed._M_elems,(Literal *)&size);
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish =
             size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish;
        size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
        size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len =
             (size_t)size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str =
             (char *)size.breakTo.super_IString.str._M_len;
      }
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                 &size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
      Literal::~Literal((Literal *)&size);
    }
    else {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)dest.breakTo.super_IString.str._M_str;
      Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                       _M_elems,(Literal *)&offset);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)offset.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      offset.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len =
           (size_t)offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str =
           (char *)offset.breakTo.super_IString.str._M_len;
    }
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &offset.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    Literal::~Literal((Literal *)&offset);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = addr.type.id;
    Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                     _M_elems,(Literal *)&dest);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)dest.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    dest.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)dest.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &dest.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  Literal::~Literal((Literal *)&dest);
  return __return_storage_ptr__;
}

Assistant:

Flow visitMemoryInit(MemoryInit* curr) {
    NOTE_ENTER("MemoryInit");
    Flow dest = self()->visit(curr->dest);
    if (dest.breaking()) {
      return dest;
    }
    Flow offset = self()->visit(curr->offset);
    if (offset.breaking()) {
      return offset;
    }
    Flow size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    NOTE_EVAL1(dest);
    NOTE_EVAL1(offset);
    NOTE_EVAL1(size);

    auto* segment = wasm.getDataSegment(curr->segment);

    Address destVal(dest.getSingleValue().getUnsigned());
    Address offsetVal(uint32_t(offset.getSingleValue().geti32()));
    Address sizeVal(uint32_t(size.getSingleValue().geti32()));

    if (offsetVal + sizeVal > 0 && droppedSegments.count(curr->segment)) {
      trap("out of bounds segment access in memory.init");
    }
    if ((uint64_t)offsetVal + sizeVal > segment->data.size()) {
      trap("out of bounds segment access in memory.init");
    }
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    if (destVal + sizeVal > memorySize * Memory::kPageSize) {
      trap("out of bounds memory access in memory.init");
    }
    for (size_t i = 0; i < sizeVal; ++i) {
      Literal addr(destVal + i);
      info.instance->externalInterface->store8(
        info.instance->getFinalAddressWithoutOffset(addr, 1, memorySize),
        segment->data[offsetVal + i],
        info.name);
    }
    return {};
  }